

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

void fulfill_or_reject_promise(JSContext *ctx,JSValue promise,JSValue value,BOOL is_reject)

{
  int iVar1;
  undefined8 uVar2;
  JSHostPromiseRejectionTracker *pJVar3;
  JSPromiseReactionData *pJVar4;
  list_head *plVar5;
  list_head *plVar6;
  JSValue v;
  JSValueUnion JVar7;
  int *piVar8;
  JSPromiseReactionData *pJVar9;
  JSValueUnion local_88;
  int64_t iStack_80;
  JSValueUnion local_78;
  int64_t iStack_70;
  JSValueUnion local_68;
  int64_t iStack_60;
  ulong local_58;
  undefined8 local_50;
  JSValueUnion local_48;
  int64_t local_40;
  
  JVar7 = value.u;
  if (((int)promise.tag == -1) && (*(short *)((long)promise.u.ptr + 6) == 0x2a)) {
    piVar8 = *(int **)((long)promise.u.ptr + 0x30);
  }
  else {
    piVar8 = (int *)0x0;
  }
  if ((piVar8 != (int *)0x0) && (*piVar8 == 0)) {
    if (0xfffffff4 < (uint)value.tag) {
      *(int *)JVar7.ptr = *JVar7.ptr + 1;
    }
    local_88 = (JSValueUnion)((JSValueUnion *)(piVar8 + 0xc))->ptr;
    uVar2 = *(undefined8 *)(piVar8 + 0xe);
    v = *(JSValue *)(piVar8 + 0xc);
    ((JSValueUnion *)(piVar8 + 0xc))->ptr = (void *)JVar7;
    *(int64_t *)(piVar8 + 0xe) = value.tag;
    if ((0xfffffff4 < (uint)uVar2) &&
       (iVar1 = *local_88.ptr, *(int *)local_88.ptr = iVar1 + -1, iVar1 < 2)) {
      __JS_FreeValueRT(ctx->rt,v);
    }
    *piVar8 = is_reject + 1;
    if ((is_reject + 1 == 2) && (piVar8[10] == 0)) {
      pJVar3 = ctx->rt->host_promise_rejection_tracker;
      if (pJVar3 != (JSHostPromiseRejectionTracker *)0x0) {
        (*pJVar3)(ctx,promise,value,0,ctx->rt->host_promise_rejection_tracker_opaque);
      }
    }
    if (*(JSPromiseReactionData **)(piVar8 + (long)is_reject * 4 + 4) !=
        (JSPromiseReactionData *)(piVar8 + (long)is_reject * 4 + 2)) {
      pJVar9 = *(JSPromiseReactionData **)(piVar8 + (long)is_reject * 4 + 4);
      do {
        pJVar4 = (JSPromiseReactionData *)(pJVar9->link).next;
        local_88 = pJVar9->resolving_funcs[0].u;
        iStack_80 = pJVar9->resolving_funcs[0].tag;
        local_78 = pJVar9->resolving_funcs[1].u;
        iStack_70 = pJVar9->resolving_funcs[1].tag;
        local_68 = (pJVar9->handler).u;
        iStack_60 = (pJVar9->handler).tag;
        local_50 = 1;
        local_58 = (ulong)(is_reject != 0);
        local_48 = JVar7;
        local_40 = value.tag;
        JS_EnqueueJob(ctx,promise_reaction_job,5,(JSValue *)&local_88);
        plVar5 = (pJVar9->link).prev;
        plVar6 = (pJVar9->link).next;
        plVar5->next = plVar6;
        plVar6->prev = plVar5;
        (pJVar9->link).prev = (list_head *)0x0;
        (pJVar9->link).next = (list_head *)0x0;
        promise_reaction_data_free(ctx->rt,pJVar9);
        pJVar9 = pJVar4;
      } while (pJVar4 != (JSPromiseReactionData *)(piVar8 + (long)is_reject * 4 + 2));
    }
    pJVar9 = *(JSPromiseReactionData **)(piVar8 + (long)(1 - is_reject) * 4 + 4);
    while (pJVar9 != (JSPromiseReactionData *)(piVar8 + (long)(1 - is_reject) * 4 + 2)) {
      plVar5 = (pJVar9->link).prev;
      pJVar4 = (JSPromiseReactionData *)(pJVar9->link).next;
      plVar5->next = (list_head *)pJVar4;
      (pJVar4->link).prev = plVar5;
      (pJVar9->link).prev = (list_head *)0x0;
      (pJVar9->link).next = (list_head *)0x0;
      promise_reaction_data_free(ctx->rt,pJVar9);
      pJVar9 = pJVar4;
    }
  }
  return;
}

Assistant:

static void fulfill_or_reject_promise(JSContext *ctx, JSValueConst promise,
                                      JSValueConst value, BOOL is_reject)
{
    JSPromiseData *s = JS_GetOpaque(promise, JS_CLASS_PROMISE);
    struct list_head *el, *el1;
    JSPromiseReactionData *rd;
    JSValueConst args[5];

    if (!s || s->promise_state != JS_PROMISE_PENDING)
        return; /* should never happen */
    set_value(ctx, &s->promise_result, JS_DupValue(ctx, value));
    s->promise_state = JS_PROMISE_FULFILLED + is_reject;
#ifdef DUMP_PROMISE
    printf("fulfill_or_reject_promise: is_reject=%d\n", is_reject);
#endif
    if (s->promise_state == JS_PROMISE_REJECTED && !s->is_handled) {
        JSRuntime *rt = ctx->rt;
        if (rt->host_promise_rejection_tracker) {
            rt->host_promise_rejection_tracker(ctx, promise, value, FALSE,
                                               rt->host_promise_rejection_tracker_opaque);
        }
    }

    list_for_each_safe(el, el1, &s->promise_reactions[is_reject]) {
        rd = list_entry(el, JSPromiseReactionData, link);
        args[0] = rd->resolving_funcs[0];
        args[1] = rd->resolving_funcs[1];
        args[2] = rd->handler;
        args[3] = JS_NewBool(ctx, is_reject);
        args[4] = value;
        JS_EnqueueJob(ctx, promise_reaction_job, 5, args);
        list_del(&rd->link);
        promise_reaction_data_free(ctx->rt, rd);
    }

    list_for_each_safe(el, el1, &s->promise_reactions[1 - is_reject]) {
        rd = list_entry(el, JSPromiseReactionData, link);
        list_del(&rd->link);
        promise_reaction_data_free(ctx->rt, rd);
    }
}